

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O3

ostream * absl::operator<<(ostream *out,Cord *cord)

{
  byte bVar1;
  CordRep *tree;
  size_t sVar2;
  ChunkIterator __begin1;
  ChunkIterator local_a8;
  
  local_a8.current_leaf_ = (CordRep *)0x0;
  local_a8.bytes_remaining_ = 0;
  local_a8.current_chunk_ = (string_view)ZEXT816(0);
  local_a8.btree_reader_.remaining_ = 0;
  local_a8.btree_reader_.navigator_.height_ = -1;
  bVar1 = (cord->contents_).data_.rep_.field_0.data[0];
  tree = (cord->contents_).data_.rep_.field_0.as_tree.rep;
  if (tree == (CordRep *)0x0 || ((long)(char)bVar1 & 1U) == 0) {
    if ((bVar1 & 1) != 0) {
LAB_001707bb:
      operator<<();
LAB_001707c0:
      __assert_fail("bytes_remaining_ >= current_chunk_.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O3/_deps/abseil-cpp-src/absl/strings/cord.h"
                    ,0x616,"Cord::ChunkIterator &absl::Cord::ChunkIterator::operator++()");
    }
    local_a8.bytes_remaining_ = (ulong)(long)(char)bVar1 >> 1;
    local_a8.current_chunk_._M_str = (char *)((long)&(cord->contents_).data_.rep_.field_0 + 1);
    local_a8.current_chunk_._M_len = local_a8.bytes_remaining_;
  }
  else {
    local_a8.bytes_remaining_ = tree->length;
    if (local_a8.bytes_remaining_ == 0) {
      return out;
    }
    Cord::ChunkIterator::InitTree(&local_a8,tree);
  }
  if (local_a8.bytes_remaining_ != 0) {
    do {
      std::ostream::write((char *)out,(long)local_a8.current_chunk_._M_str);
      if (local_a8.bytes_remaining_ == 0) {
        operator<<();
        goto LAB_001707bb;
      }
      sVar2 = local_a8.bytes_remaining_ - local_a8.current_chunk_._M_len;
      if (local_a8.bytes_remaining_ < local_a8.current_chunk_._M_len) goto LAB_001707c0;
      local_a8.bytes_remaining_ = sVar2;
      if (sVar2 != 0) {
        if (((long)local_a8.btree_reader_.navigator_.height_ < 0) ||
           (local_a8.btree_reader_.navigator_.node_[local_a8.btree_reader_.navigator_.height_] ==
            (CordRepBtree *)0x0)) {
          if (local_a8.current_chunk_._M_len == 0) {
            __assert_fail("!current_chunk_.empty()",
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O3/_deps/abseil-cpp-src/absl/strings/cord.h"
                          ,0x61c,"Cord::ChunkIterator &absl::Cord::ChunkIterator::operator++()");
          }
          local_a8.current_chunk_ = (string_view)ZEXT816(0);
        }
        else {
          local_a8.current_chunk_ = cord_internal::CordRepBtreeReader::Next(&local_a8.btree_reader_)
          ;
        }
      }
    } while (local_a8.bytes_remaining_ != 0);
  }
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const Cord& cord) {
  for (absl::string_view chunk : cord.Chunks()) {
    out.write(chunk.data(), static_cast<std::streamsize>(chunk.size()));
  }
  return out;
}